

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandMajExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint local_4c;
  uint local_48;
  int fVerbose;
  int nRands;
  int fUseRand;
  int fGlucose;
  int fUseLine;
  int fUseConst;
  int nNodes;
  int nVars;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fUseConst = 3;
  fUseLine = 1;
  fGlucose = 0;
  fUseRand = 0;
  bVar1 = false;
  fVerbose = 0;
  local_48 = 0;
  local_4c = 1;
  Extra_UtilGetoptReset();
LAB_0026fcb2:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"INRfcrgvh");
    if (iVar2 == -1) {
      if ((fUseConst & 1U) == 0) {
        Abc_Print(-1,"Cannot sythesize MAJ gate with an even number of inputs (%d).\n",
                  (ulong)(uint)fUseConst);
        return 1;
      }
      if (bVar1) {
        Maj_ManExactSynthesis(fUseConst,fUseLine,fGlucose,fUseRand,local_4c);
      }
      else {
        Maj_ManExactSynthesis2(fUseConst,fUseLine,fGlucose,fUseRand,fVerbose,local_48,local_4c);
      }
      return 0;
    }
    switch(iVar2) {
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_0026fedb;
      }
      fUseConst = atoi(argv[globalUtilOptind]);
      uVar3 = fUseConst;
      break;
    default:
      goto LAB_0026fedb;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_0026fedb;
      }
      fUseLine = atoi(argv[globalUtilOptind]);
      uVar3 = fUseLine;
      break;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_0026fedb;
      }
      local_48 = atoi(argv[globalUtilOptind]);
      uVar3 = local_48;
      break;
    case 99:
      fUseRand = fUseRand ^ 1;
      goto LAB_0026fcb2;
    case 0x66:
      fGlucose = fGlucose ^ 1;
      goto LAB_0026fcb2;
    case 0x67:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0026fcb2;
    case 0x68:
      goto LAB_0026fedb;
    case 0x72:
      fVerbose = fVerbose ^ 1;
      goto LAB_0026fcb2;
    case 0x76:
      local_4c = local_4c ^ 1;
      goto LAB_0026fcb2;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar3 < 0) {
LAB_0026fedb:
      Abc_Print(-2,"usage: majexact [-INR <num>] [-fcrgvh]\n");
      Abc_Print(-2,"\t           exact synthesis of multi-input MAJ using MAJ3 gates\n");
      Abc_Print(-2,"\t-I <num> : the number of input variables [default = %d]\n",
                (ulong)(uint)fUseConst);
      Abc_Print(-2,"\t-N <num> : the number of MAJ3 nodes [default = %d]\n",(ulong)(uint)fUseLine);
      Abc_Print(-2,"\t-R <num> : the number of additional connections [default = %d]\n",
                (ulong)local_48);
      pcVar4 = "no";
      if (fGlucose != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-f       : toggle using constant fanins [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (fUseRand != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-c       : toggle using cascade topology [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (fVerbose != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-r       : toggle using random topology [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (bVar1) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,
                "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n"
                ,pcVar4);
      pcVar4 = "no";
      if (local_4c != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandMajExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Maj_ManExactSynthesis( int nVars, int nNodes, int fUseConst, int fUseLine, int fVerbose );
    extern int Maj_ManExactSynthesis2( int nVars, int nNodes, int fUseConst, int fUseLine, int fUseRand, int nRands, int fVerbose );
    int c, nVars = 3, nNodes = 1, fUseConst = 0, fUseLine = 0, fGlucose = 0, fUseRand = 0, nRands = 0, fVerbose = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "INRfcrgvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVars < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nNodes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodes < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nRands = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRands < 0 )
                goto usage;
            break;
        case 'f':
            fUseConst ^= 1;
            break;
        case 'c':
            fUseLine ^= 1;
            break;
        case 'r':
            fUseRand ^= 1;
            break;
        case 'g':
            fGlucose ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( (nVars & 1) == 0 )
    {
        Abc_Print( -1, "Cannot sythesize MAJ gate with an even number of inputs (%d).\n", nVars );
        return 1;
    }
    if ( fGlucose )
        Maj_ManExactSynthesis( nVars, nNodes, fUseConst, fUseLine, fVerbose );
    else
        Maj_ManExactSynthesis2( nVars, nNodes, fUseConst, fUseLine, fUseRand, nRands, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: majexact [-INR <num>] [-fcrgvh]\n" );
    Abc_Print( -2, "\t           exact synthesis of multi-input MAJ using MAJ3 gates\n" );
    Abc_Print( -2, "\t-I <num> : the number of input variables [default = %d]\n", nVars );
    Abc_Print( -2, "\t-N <num> : the number of MAJ3 nodes [default = %d]\n", nNodes );
    Abc_Print( -2, "\t-R <num> : the number of additional connections [default = %d]\n", nRands );
    Abc_Print( -2, "\t-f       : toggle using constant fanins [default = %s]\n", fUseConst ? "yes" : "no" );
    Abc_Print( -2, "\t-c       : toggle using cascade topology [default = %s]\n", fUseLine ? "yes" : "no" );
    Abc_Print( -2, "\t-r       : toggle using random topology [default = %s]\n", fUseRand ? "yes" : "no" );
    Abc_Print( -2, "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n", fGlucose ? "yes" : "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n" );
    return 1;
}